

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O2

Gia_MmStep_t * Gia_MmStepStart(int nSteps)

{
  int iVar1;
  Gia_MmStep_t *pGVar2;
  Gia_MmFixed_t **ppGVar3;
  Gia_MmFixed_t *pGVar4;
  Gia_MmFixed_t **ppGVar5;
  char **ppcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pGVar2 = (Gia_MmStep_t *)calloc(1,0x30);
  pGVar2->nMems = nSteps;
  ppGVar3 = (Gia_MmFixed_t **)malloc((long)nSteps * 8);
  pGVar2->pMems = ppGVar3;
  uVar9 = 0;
  uVar8 = 0;
  if (0 < nSteps) {
    uVar8 = (ulong)(uint)nSteps;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pGVar4 = Gia_MmFixedStart(8 << ((byte)uVar9 & 0x1f),0x2000);
    ppGVar3[uVar9] = pGVar4;
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pGVar2->nMapSize = iVar1;
  ppGVar5 = (Gia_MmFixed_t **)malloc((long)(iVar1 + 1) << 3);
  *ppGVar5 = (Gia_MmFixed_t *)0x0;
  pGVar2->pMap = ppGVar5;
  pGVar4 = *ppGVar3;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    ppGVar5[lVar7 + 1] = pGVar4;
  }
  for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    for (lVar7 = (long)((4 << ((byte)uVar9 & 0x1f)) + 1); lVar7 <= 8 << ((byte)uVar9 & 0x1f);
        lVar7 = lVar7 + 1) {
      ppGVar5[lVar7] = ppGVar3[uVar9];
    }
  }
  pGVar2->nChunksAlloc = 0x40;
  pGVar2->nChunks = 0;
  ppcVar6 = (char **)malloc(0x200);
  pGVar2->pChunks = ppcVar6;
  return pGVar2;
}

Assistant:

Gia_MmStep_t * Gia_MmStepStart( int nSteps )
{
    Gia_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Gia_MmStep_t, 1 );
    memset( p, 0, sizeof(Gia_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Gia_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Gia_MmFixedStart( (8<<i), (1<<13) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Gia_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}